

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int new_node(huffman_code *code)

{
  int iVar1;
  huffman_tree_node *phVar2;
  
  phVar2 = (huffman_tree_node *)realloc(code->tree,(long)code->numentries * 8 + 8);
  if (phVar2 == (huffman_tree_node *)0x0) {
    iVar1 = -1;
  }
  else {
    code->tree = phVar2;
    *(undefined8 *)phVar2[code->numentries].branches = 0xfffffffeffffffff;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
new_node(struct huffman_code *code)
{
  void *new_tree;

  new_tree = realloc(code->tree, (code->numentries + 1) * sizeof(*code->tree));
  if (new_tree == NULL)
    return (-1);
  code->tree = (struct huffman_tree_node *)new_tree;
  code->tree[code->numentries].branches[0] = -1;
  code->tree[code->numentries].branches[1] = -2;
  return 1;
}